

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O2

fdb_status fdb_free_kvs_name_list(fdb_kvs_name_list *kvs_name_list)

{
  if (kvs_name_list != (fdb_kvs_name_list *)0x0) {
    free(kvs_name_list->kvs_names);
    kvs_name_list->num_kvs_names = 0;
    kvs_name_list->kvs_names = (char **)0x0;
    return FDB_RESULT_SUCCESS;
  }
  return FDB_RESULT_INVALID_ARGS;
}

Assistant:

LIBFDB_API
fdb_status fdb_free_kvs_name_list(fdb_kvs_name_list *kvs_name_list)
{
    if (!kvs_name_list) {
        return FDB_RESULT_INVALID_ARGS;
    }

    free(kvs_name_list->kvs_names);
    kvs_name_list->kvs_names = NULL;
    kvs_name_list->num_kvs_names = 0;

    return FDB_RESULT_SUCCESS;
}